

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_compress.c
# Opt level: O0

u32 deflate_compute_true_cost(libdeflate_compressor *c)

{
  long in_RDI;
  uint sym;
  u32 cost;
  uint local_10;
  u32 local_c;
  
  deflate_precompute_huffman_header((libdeflate_compressor *)0x11854b);
  memset((void *)(in_RDI + 0xa80 + (ulong)*(uint *)(in_RDI + 0x17ac)),0,
         (ulong)(0x120 - *(int *)(in_RDI + 0x17ac)));
  local_c = *(int *)(in_RDI + 0x17b4) * 3 + 0xe;
  for (local_10 = 0; local_10 < 0x13; local_10 = local_10 + 1) {
    local_c = *(int *)(in_RDI + 0x1200 + (ulong)local_10 * 4) *
              ((uint)*(byte *)(in_RDI + 0x1298 + (ulong)local_10) + (uint)""[local_10]) + local_c;
  }
  for (local_10 = 0; local_10 < 0x101; local_10 = local_10 + 1) {
    local_c = *(int *)(in_RDI + 0x28 + (ulong)local_10 * 4) *
              (uint)*(byte *)(in_RDI + 0xa80 + (ulong)local_10) + local_c;
  }
  for (; local_10 < 0x11e; local_10 = local_10 + 1) {
    local_c = *(int *)(in_RDI + 0x28 + (ulong)local_10 * 4) *
              ((uint)*(byte *)(in_RDI + 0xa80 + (ulong)local_10) + (uint)""[local_10 - 0x101]) +
              local_c;
  }
  for (local_10 = 0; local_10 < 0x1e; local_10 = local_10 + 1) {
    local_c = *(int *)(in_RDI + 0x4a8 + (ulong)local_10 * 4) *
              ((uint)*(byte *)(in_RDI + 0xba0 + (ulong)local_10) + (uint)""[local_10]) + local_c;
  }
  return local_c;
}

Assistant:

static u32
deflate_compute_true_cost(struct libdeflate_compressor *c)
{
	u32 cost = 0;
	unsigned sym;

	deflate_precompute_huffman_header(c);

	memset(&c->codes.lens.litlen[c->o.precode.num_litlen_syms], 0,
	       DEFLATE_NUM_LITLEN_SYMS - c->o.precode.num_litlen_syms);

	cost += 5 + 5 + 4 + (3 * c->o.precode.num_explicit_lens);
	for (sym = 0; sym < DEFLATE_NUM_PRECODE_SYMS; sym++) {
		cost += c->o.precode.freqs[sym] *
			(c->o.precode.lens[sym] +
			 deflate_extra_precode_bits[sym]);
	}

	for (sym = 0; sym < DEFLATE_FIRST_LEN_SYM; sym++)
		cost += c->freqs.litlen[sym] * c->codes.lens.litlen[sym];

	for (; sym < DEFLATE_FIRST_LEN_SYM +
	       ARRAY_LEN(deflate_extra_length_bits); sym++)
		cost += c->freqs.litlen[sym] *
			(c->codes.lens.litlen[sym] +
			 deflate_extra_length_bits[sym - DEFLATE_FIRST_LEN_SYM]);

	for (sym = 0; sym < ARRAY_LEN(deflate_extra_offset_bits); sym++)
		cost += c->freqs.offset[sym] *
			(c->codes.lens.offset[sym] +
			 deflate_extra_offset_bits[sym]);
	return cost;
}